

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_once_resolved(Curl_easy *data,_Bool *protocol_done)

{
  connectdata *conn_00;
  CURLcode CVar1;
  connectdata *conn;
  CURLcode result;
  _Bool *protocol_done_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if ((data->state).async.dns != (Curl_dns_entry *)0x0) {
    conn_00->dns_entry = (data->state).async.dns;
    (data->state).async.dns = (Curl_dns_entry *)0x0;
  }
  CVar1 = Curl_setup_conn(data,protocol_done);
  if (CVar1 != CURLE_OK) {
    Curl_detach_connnection(data);
    Curl_conncache_remove_conn(data,conn_00,true);
    Curl_disconnect(data,conn_00,true);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_once_resolved(struct Curl_easy *data, bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn = data->conn;

#ifdef USE_CURL_ASYNC
  if(data->state.async.dns) {
    conn->dns_entry = data->state.async.dns;
    data->state.async.dns = NULL;
  }
#endif

  result = Curl_setup_conn(data, protocol_done);

  if(result) {
    Curl_detach_connnection(data);
    Curl_conncache_remove_conn(data, conn, TRUE);
    Curl_disconnect(data, conn, TRUE);
  }
  return result;
}